

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

double task3(Matrix *A)

{
  rep rVar1;
  duration<long,_std::ratio<1L,_1000000000L>_> local_78;
  duration<long,_std::ratio<1L,_1000L>_> local_70;
  rep local_68;
  Matrix local_50;
  undefined1 local_40 [8];
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> ans;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  end;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  start;
  Matrix *A_local;
  
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&end);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&local_20);
  ans.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)std::chrono::_V2::system_clock::now();
  end.__d.__r = (duration)
                (duration)
                ans.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  Matrix::Matrix(&local_50,A);
  EigQR((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_40,&local_50,
        &it);
  Matrix::~Matrix(&local_50);
  local_68 = std::chrono::_V2::system_clock::now();
  local_20.__d.__r = (duration)(duration)local_68;
  local_78.__r = (rep)std::chrono::operator-(&local_20,&end);
  local_70.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_78);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_70);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_40);
  return (double)rVar1;
}

Assistant:

double task3(Matrix A)
{
    std::chrono::time_point<std::chrono::high_resolution_clock> start, end;

    start = std::chrono::high_resolution_clock::now();
    auto ans = EigQR(std::move(A));
    end = std::chrono::high_resolution_clock::now();

    return std::chrono::duration_cast<std::chrono::milliseconds>(end - start).count();
}